

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O0

int32_t uloc_getDisplayLanguage_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  int32_t iVar1;
  UErrorCode *pErrorCode_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  char *displayLocale_local;
  char *locale_local;
  
  iVar1 = _getDisplayNameForComponent
                    (locale,displayLocale,dest,destCapacity,uloc_getLanguage_63,"Languages",
                     pErrorCode);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayLanguage(const char *locale,
                        const char *displayLocale,
                        UChar *dest, int32_t destCapacity,
                        UErrorCode *pErrorCode) {
    return _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                uloc_getLanguage, _kLanguages, pErrorCode);
}